

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O1

void cfl_store_dc_pred(MACROBLOCKD *xd,uint8_t *input,CFL_PRED_TYPE pred_plane,int width)

{
  if ((xd->cur_buf->flags & 8) == 0) {
    memcpy((xd->cfl).dc_pred_cache + pred_plane,input,(long)width);
    return;
  }
  memcpy((xd->cfl).dc_pred_cache + pred_plane,(void *)((long)input * 2),(long)(width * 2));
  return;
}

Assistant:

static inline int is_cur_buf_hbd(const MACROBLOCKD *xd) {
#if CONFIG_AV1_HIGHBITDEPTH
  return xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH ? 1 : 0;
#else
  (void)xd;
  return 0;
#endif
}